

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O0

png_uint_32 png_image_format(png_structrp png_ptr)

{
  uint local_14;
  png_uint_32 format;
  png_structrp png_ptr_local;
  
  local_14 = 0;
  if ((png_ptr->color_type & 2) != 0) {
    local_14 = 2;
  }
  if ((png_ptr->color_type & 4) == 0) {
    if (png_ptr->num_trans != 0) {
      local_14 = local_14 | 1;
    }
  }
  else {
    local_14 = local_14 | 1;
  }
  if (png_ptr->bit_depth == '\x10') {
    local_14 = local_14 | 4;
  }
  if ((png_ptr->color_type & 1) != 0) {
    local_14 = local_14 | 8;
  }
  return local_14;
}

Assistant:

static png_uint_32
png_image_format(png_structrp png_ptr)
{
   png_uint_32 format = 0;

   if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) != 0)
      format |= PNG_FORMAT_FLAG_COLOR;

   if ((png_ptr->color_type & PNG_COLOR_MASK_ALPHA) != 0)
      format |= PNG_FORMAT_FLAG_ALPHA;

   /* Use png_ptr here, not info_ptr, because by examination png_handle_tRNS
    * sets the png_struct fields; that's all we are interested in here.  The
    * precise interaction with an app call to png_set_tRNS and PNG file reading
    * is unclear.
    */
   else if (png_ptr->num_trans > 0)
      format |= PNG_FORMAT_FLAG_ALPHA;

   if (png_ptr->bit_depth == 16)
      format |= PNG_FORMAT_FLAG_LINEAR;

   if ((png_ptr->color_type & PNG_COLOR_MASK_PALETTE) != 0)
      format |= PNG_FORMAT_FLAG_COLORMAP;

   return format;
}